

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

blocking_t __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_4UL>::query
          (basic_executor_type<std::allocator<void>,_4UL> *this,blocking_t param_2)

{
  uintptr_t uVar1;
  basic_executor_type<std::allocator<void>,_4UL> *in_RDI;
  blocking_t<0> local_4;
  
  uVar1 = bits(in_RDI);
  if ((uVar1 & 1) == 0) {
    execution::detail::blocking_t<0>::blocking_t(&local_4);
  }
  else {
    execution::detail::blocking_t<0>::blocking_t(&local_4);
  }
  return (blocking_t)local_4.value_;
}

Assistant:

constexpr execution::blocking_t query(execution::blocking_t) const noexcept
  {
    return (bits() & blocking_never)
      ? execution::blocking_t(execution::blocking.never)
      : execution::blocking_t(execution::blocking.possibly);
  }